

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::verifyTestResult
          (TestStatus *__return_storage_ptr__,GraphicsCacheTestInstance *this)

{
  TextureFormat TVar1;
  TestLog *log;
  TestStatus *pTVar2;
  bool bVar3;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *pAVar4;
  ConstPixelBufferAccess local_b8;
  TestStatus *local_90;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultCache;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultNoCache;
  UVec4 local_68;
  ConstPixelBufferAccess local_58;
  
  local_90 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_CacheTestInstance).super_TestInstance.m_context);
  queue = Context::getUniversalQueue((this->super_CacheTestInstance).super_TestInstance.m_context);
  pAVar4 = Context::getDefaultAllocator
                     ((this->super_CacheTestInstance).super_TestInstance.m_context);
  readColorAttachment(&resultNoCache,vk,device,queue,queueFamilyIndex,pAVar4,
                      (VkImage)this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  pAVar4 = Context::getDefaultAllocator
                     ((this->super_CacheTestInstance).super_TestInstance.m_context);
  readColorAttachment(&resultCache,vk,device,queue,queueFamilyIndex,pAVar4,
                      (VkImage)this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  log = ((this->super_CacheTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_b8,
             resultNoCache.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_58,
             resultCache.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
             .m_data.ptr);
  pTVar2 = local_90;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  local_68.m_data[3] = 1;
  bVar3 = tcu::intThresholdCompare
                    (log,"IntImageCompare","Image comparison",&local_b8,&local_58,&local_68,
                     COMPARE_LOG_RESULT);
  TVar1 = (TextureFormat)(local_b8.m_size.m_data + 2);
  local_b8.m_format = TVar1;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Render images w/o cached pipeline match.","");
    pTVar2->m_code = QP_TEST_RESULT_PASS;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_b8.m_format,
               (undefined1 *)(local_b8.m_size.m_data._0_8_ + (long)local_b8.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Render Images mismatch.","");
    pTVar2->m_code = QP_TEST_RESULT_FAIL;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_b8.m_format,
               (undefined1 *)(local_b8.m_size.m_data._0_8_ + (long)local_b8.m_format));
  }
  if (local_b8.m_format != TVar1) {
    operator_delete((void *)local_b8.m_format,local_b8._16_8_ + 1);
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&resultCache.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&resultNoCache.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  return pTVar2;
}

Assistant:

tcu::TestStatus GraphicsCacheTestInstance::verifyTestResult (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();
	const deUint32          queueFamilyIndex = m_context.getUniversalQueueFamilyIndex();

	const VkQueue                   queue               = m_context.getUniversalQueue();
	de::MovePtr<tcu::TextureLevel>  resultNoCache       = readColorAttachment(vk,
																			  vkDevice,
																			  queue,
																			  queueFamilyIndex,
																			  m_context.getDefaultAllocator(),
																			  *m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],
																			  m_colorFormat,
																			  m_renderSize);
	de::MovePtr<tcu::TextureLevel>  resultCache         = readColorAttachment(vk,
																			  vkDevice,
																			  queue,
																			  queueFamilyIndex,
																			  m_context.getDefaultAllocator(),
																			  *m_colorImage[PIPELINE_CACHE_NDX_CACHED],
																			  m_colorFormat,
																			  m_renderSize);

	bool compareOk = tcu::intThresholdCompare(m_context.getTestContext().getLog(),
											  "IntImageCompare",
											  "Image comparison",
											  resultNoCache->getAccess(),
											  resultCache->getAccess(),
											  tcu::UVec4(1, 1, 1, 1),
											  tcu::COMPARE_LOG_RESULT);

	if (compareOk)
		return tcu::TestStatus::pass("Render images w/o cached pipeline match.");
	else
		return tcu::TestStatus::fail("Render Images mismatch.");
}